

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O1

ssize_t __thiscall LayoutFile::write(LayoutFile *this,int __fd,void *__buf,size_t __n)

{
  Widget *pWVar1;
  undefined1 *in_RAX;
  undefined1 *extraout_RAX;
  undefined4 in_register_00000034;
  string xml;
  undefined1 *local_30;
  uint local_28;
  undefined1 local_20 [16];
  
  pWVar1 = this->root;
  if (pWVar1 != (Widget *)0x0) {
    (**pWVar1->_vptr_Widget)(&local_30,pWVar1,0);
    fwrite(local_30,1,(ulong)local_28,(FILE *)CONCAT44(in_register_00000034,__fd));
    fflush((FILE *)CONCAT44(in_register_00000034,__fd));
    in_RAX = local_20;
    if (local_30 != in_RAX) {
      operator_delete(local_30);
      in_RAX = extraout_RAX;
    }
  }
  return (ssize_t)in_RAX;
}

Assistant:

void LayoutFile::write(FILE *f)
{
	if (root == nullptr)
		return;
	std::string xml = root->writeXml(0);
	unsigned int len = xml.length();
	fwrite(xml.c_str(), sizeof(char), len, f);
	fflush(f);
}